

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::ReleaseLast
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  ExtensionSet *this_00;
  MessageLite *pMVar1;
  RepeatedPtrFieldBase *this_01;
  Type *pTVar2;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseLast","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseLast",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseLast",CPPTYPE_MESSAGE);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    this_00 = MutableExtensionSet(this,message);
    pMVar1 = ExtensionSet::ReleaseLast(this_00,*(int *)(field + 0x28));
    return (Message *)pMVar1;
  }
  this_01 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
  pTVar2 = RepeatedPtrFieldBase::
           ReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                     (this_01);
  return pTVar2;
}

Assistant:

Message* GeneratedMessageReflection::ReleaseLast(
    Message* message,
    const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(ReleaseLast, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->ReleaseLast(field->number()));
  } else {
    return MutableRaw<RepeatedPtrFieldBase>(message, field)
        ->ReleaseLast<GenericTypeHandler<Message> >();
  }
}